

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACTable.cpp
# Opt level: O1

void __thiscall ACTable::Sort(ACTable *this,ACTColumnsTy _col,bool _asc)

{
  __normal_iterator<FDInfo_*,_std::vector<FDInfo,_std::allocator<FDInfo>_>_> __first;
  __normal_iterator<FDInfo_*,_std::vector<FDInfo,_std::allocator<FDInfo>_>_> __last;
  FDInfo *pFVar1;
  long lVar2;
  ulong uVar3;
  FDInfo *__b;
  _Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_TwinFan[P]LiveTraffic_Src_ACTable_cpp:513:19)>
  __comp;
  __normal_iterator<FDInfo_*,_std::vector<FDInfo,_std::allocator<FDInfo>_>_> __i;
  __normal_iterator<FDInfo_*,_std::vector<FDInfo,_std::allocator<FDInfo>_>_> _Var4;
  FDInfo *__a;
  
  if (_col < ACT_COL_COUNT) {
    __first._M_current =
         (this->vecFDI).super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.
         super__Vector_impl_data._M_start;
    __last._M_current =
         (this->vecFDI).super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if ((_col == ACT_COL_PHASE) || (gCols._M_elems[_col].colAlign == IM_ALIGN_RIGHT)) {
      if (__first._M_current != __last._M_current) {
        __comp._M_comp._asc = _asc;
        __comp._M_comp._col = _col;
        __comp._M_comp._5_3_ = 0;
        uVar3 = ((long)__last._M_current - (long)__first._M_current >> 4) * 0x2fd2fd2fd2fd2fd3;
        lVar2 = 0x3f;
        if (uVar3 != 0) {
          for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<FDInfo*,std::vector<FDInfo,std::allocator<FDInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ACTable::Sort(ACTColumnsTy,bool)::__0>>
                  (__first,__last,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_TwinFan[P]LiveTraffic_Src_ACTable_cpp:513:19)>
                    )__comp._M_comp);
        if ((long)__last._M_current - (long)__first._M_current < 0x5b01) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<FDInfo*,std::vector<FDInfo,std::allocator<FDInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<ACTable::Sort(ACTColumnsTy,bool)::__0>>
                    (__first,__last,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_TwinFan[P]LiveTraffic_Src_ACTable_cpp:513:19)>
                      )__comp._M_comp);
        }
        else {
          _Var4._M_current = __first._M_current + 0x10;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<FDInfo*,std::vector<FDInfo,std::allocator<FDInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<ACTable::Sort(ACTColumnsTy,bool)::__0>>
                    (__first,_Var4,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_TwinFan[P]LiveTraffic_Src_ACTable_cpp:513:19)>
                      )__comp._M_comp);
          for (; _Var4._M_current != __last._M_current; _Var4._M_current = _Var4._M_current + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<FDInfo*,std::vector<FDInfo,std::allocator<FDInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<ACTable::Sort(ACTColumnsTy,bool)::__0>>
                      (_Var4,__comp);
          }
        }
      }
    }
    else if (__first._M_current != __last._M_current) {
      uVar3 = ((long)__last._M_current - (long)__first._M_current >> 4) * 0x2fd2fd2fd2fd2fd3;
      lVar2 = 0x3f;
      if (uVar3 != 0) {
        for (; uVar3 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<FDInfo*,std::vector<FDInfo,std::allocator<FDInfo>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<ACTable::Sort(ACTColumnsTy,bool)::__1>>
                (__first,__last,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_TwinFan[P]LiveTraffic_Src_ACTable_cpp:526:19)>
                  )_col);
      if ((long)__last._M_current - (long)__first._M_current < 0x5b01) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<FDInfo*,std::vector<FDInfo,std::allocator<FDInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<ACTable::Sort(ACTColumnsTy,bool)::__1>>
                  (__first,__last,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_TwinFan[P]LiveTraffic_Src_ACTable_cpp:526:19)>
                    )_col);
      }
      else {
        _Var4._M_current = __first._M_current + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<FDInfo*,std::vector<FDInfo,std::allocator<FDInfo>>>,__gnu_cxx::__ops::_Iter_comp_iter<ACTable::Sort(ACTColumnsTy,bool)::__1>>
                  (__first,_Var4,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_TwinFan[P]LiveTraffic_Src_ACTable_cpp:526:19)>
                    )_col);
        for (; _Var4._M_current != __last._M_current; _Var4._M_current = _Var4._M_current + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<FDInfo*,std::vector<FDInfo,std::allocator<FDInfo>>>,__gnu_cxx::__ops::_Val_comp_iter<ACTable::Sort(ACTColumnsTy,bool)::__1>>
                    (_Var4,(_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_TwinFan[P]LiveTraffic_Src_ACTable_cpp:526:19)>
                            )_col);
        }
      }
    }
    if (!_asc) {
      __a = (this->vecFDI).super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
      pFVar1 = (this->vecFDI).super__Vector_base<FDInfo,_std::allocator<FDInfo>_>._M_impl.
               super__Vector_impl_data._M_finish;
      __b = pFVar1 + -1;
      if (__a < __b && __a != pFVar1) {
        do {
          std::swap<FDInfo>(__a,__b);
          __a = __a + 1;
          __b = __b + -1;
        } while (__a < __b);
      }
    }
    return;
  }
  std::__throw_out_of_range_fmt
            ("array::at: __n (which is %zu) >= _Nm (which is %zu)",(ulong)_col,0x27);
}

Assistant:

void ACTable::Sort (ACTColumnsTy _col, bool _asc)
{
    // All right-aligned data is treated as numeric, using the numeric `vf` array,
    // so is the "flight phase", which gets sorted by its numeric value, too:
    if (gCols.at(_col).colAlign == ImGui::IM_ALIGN_RIGHT ||
        _col == ACT_COL_PHASE) {
        std::sort(vecFDI.begin(), vecFDI.end(),
                  [_col,_asc](const FDInfo& a, const FDInfo& b)
        {
            const float af = a.vf[_col]; const bool a_nan = std::isnan(af);
            const float bf = b.vf[_col]; const bool b_nan = std::isnan(bf);
            if (!a_nan && !b_nan)       // standard case: both value defined
                return af < bf;
            if (a_nan && b_nan)         // both NAN -> considered equal, for a stable sort let the key decide
                return a.key < b.key;
            return a_nan != _asc;       // one of them is NAN -> make NAN appear always at the end
        });
    } else {
        // otherwise we sort by text
        std::sort(vecFDI.begin(), vecFDI.end(),
                  [_col](const FDInfo& a, const FDInfo& b)
        {
            const int cmp = a.v[_col].compare(b.v[_col]);
            return
            cmp == 0 ? a.key < b.key :  // in case of equality let the key decide for a stable sorting order
            cmp < 0;
        });
    }
    
    // Sort descending?
    if (!_asc)
        std::reverse(vecFDI.begin(), vecFDI.end());
}